

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O3

void __thiscall IR::MultiBranchInstr::ClearTarget(MultiBranchInstr *this)

{
  OpCode OVar1;
  Kind KVar2;
  long *plVar3;
  LabelInstr *pLVar4;
  long lVar5;
  code *pcVar6;
  bool bVar7;
  uint uVar8;
  undefined4 *puVar9;
  long lVar10;
  LPCSTR message;
  long lVar11;
  char *error;
  uint lineNumber;
  char *fileName;
  ulong uVar12;
  int iVar13;
  long *plVar14;
  BranchDictionary *branchDictionary;
  
  bVar7 = (this->super_BranchInstr).m_isMultiBranch;
  if ((this->super_BranchInstr).m_branchTarget == (LabelInstr *)0x0) {
    fileName = (char *)this;
    if (bVar7 != false) goto LAB_004b68af;
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    fileName = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl";
    error = "(m_isMultiBranch)";
    message = "m_isMultiBranch";
    lineNumber = 0x20e;
  }
  else {
    if (bVar7 == false) {
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    }
    else {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x209,"(!m_isMultiBranch)","!m_isMultiBranch");
      if (!bVar7) goto LAB_004b699d;
      *puVar9 = 0;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar9 = 1;
    fileName = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp";
    error = "(IsMultiBranch())";
    message = "IsMultiBranch()";
    lineNumber = 0x700;
  }
  bVar7 = Js::Throw::ReportAssert(fileName,lineNumber,error,message);
  if (!bVar7) {
LAB_004b699d:
    pcVar6 = (code *)invalidInstructionException();
    (*pcVar6)();
  }
  *puVar9 = 0;
LAB_004b68af:
  plVar3 = (long *)this->m_branchTargets;
  if (plVar3 != (long *)0x0) {
    KVar2 = this->m_kind;
    if ((KVar2 == IntJumpTable) || (KVar2 == SingleCharStrJumpTable)) {
      plVar14 = plVar3 + 1;
      lVar11 = this->m_baseCaseValue;
      lVar10 = this->m_lastCaseValue;
      if (lVar11 <= lVar10) {
        lVar5 = *plVar3;
        do {
          pLVar4 = *(LabelInstr **)(lVar5 + this->m_baseCaseValue * -8 + lVar11 * 8);
          if (pLVar4 != (LabelInstr *)0x0) {
            LabelInstr::RemoveLabelRef(pLVar4,&this->super_BranchInstr);
            lVar10 = this->m_lastCaseValue;
          }
          lVar11 = lVar11 + 1;
        } while (lVar11 <= lVar10);
      }
    }
    else {
      if (KVar2 != StrDictionary) {
        ClearTarget();
        OVar1 = (((MultiBranchInstr *)fileName)->super_BranchInstr).super_Instr.m_opcode;
        if (OVar1 < BrHasSideEffects) {
          if (OVar1 < BrOnEmpty) {
            switch(OVar1) {
            case Br:
              return;
            case BrNotHasSideEffects:
              (((MultiBranchInstr *)fileName)->super_BranchInstr).super_Instr.m_opcode =
                   BrHasSideEffects;
              return;
            case BrFncNeqApply:
              (((MultiBranchInstr *)fileName)->super_BranchInstr).super_Instr.m_opcode =
                   BrFncEqApply;
              return;
            case BrEq_A:
              (((MultiBranchInstr *)fileName)->super_BranchInstr).super_Instr.m_opcode = BrNotEq_A;
              return;
            case BrNeq_A:
              (((MultiBranchInstr *)fileName)->super_BranchInstr).super_Instr.m_opcode = BrNotNeq_A;
              return;
            case BrFalse_A:
              (((MultiBranchInstr *)fileName)->super_BranchInstr).super_Instr.m_opcode = BrTrue_A;
              return;
            case BrTrue_A:
              (((MultiBranchInstr *)fileName)->super_BranchInstr).super_Instr.m_opcode = BrFalse_A;
              return;
            case BrGe_A:
              (((MultiBranchInstr *)fileName)->super_BranchInstr).super_Instr.m_opcode = BrNotGe_A;
              return;
            case BrGt_A:
              (((MultiBranchInstr *)fileName)->super_BranchInstr).super_Instr.m_opcode = BrNotGt_A;
              return;
            case BrLt_A:
              (((MultiBranchInstr *)fileName)->super_BranchInstr).super_Instr.m_opcode = BrNotLt_A;
              return;
            case BrLe_A:
              (((MultiBranchInstr *)fileName)->super_BranchInstr).super_Instr.m_opcode = BrNotLe_A;
              return;
            case BrSrEq_A:
              (((MultiBranchInstr *)fileName)->super_BranchInstr).super_Instr.m_opcode = BrSrNotEq_A
              ;
              return;
            case BrSrNeq_A:
              (((MultiBranchInstr *)fileName)->super_BranchInstr).super_Instr.m_opcode =
                   BrSrNotNeq_A;
              return;
            case BrOnHasLocalProperty:
              (((MultiBranchInstr *)fileName)->super_BranchInstr).super_Instr.m_opcode =
                   BrOnNoLocalProperty;
              return;
            }
          }
          else {
            if (OVar1 == BrOnEmpty) {
              (((MultiBranchInstr *)fileName)->super_BranchInstr).super_Instr.m_opcode =
                   BrOnNotEmpty;
              return;
            }
            if (OVar1 == BrOnHasProperty) {
              (((MultiBranchInstr *)fileName)->super_BranchInstr).super_Instr.m_opcode =
                   BrOnNoProperty;
              return;
            }
            if (OVar1 == BrOnNoProperty) {
              (((MultiBranchInstr *)fileName)->super_BranchInstr).super_Instr.m_opcode =
                   BrOnHasProperty;
              return;
            }
          }
        }
        else if (OVar1 < BrOnNotEmpty) {
          switch(OVar1) {
          case BrHasSideEffects:
            (((MultiBranchInstr *)fileName)->super_BranchInstr).super_Instr.m_opcode =
                 BrNotHasSideEffects;
            return;
          case BrFncEqApply:
            (((MultiBranchInstr *)fileName)->super_BranchInstr).super_Instr.m_opcode = BrFncNeqApply
            ;
            return;
          case BrUnGe_A:
            (((MultiBranchInstr *)fileName)->super_BranchInstr).super_Instr.m_opcode = BrUnLt_A;
            return;
          case BrUnGt_A:
            (((MultiBranchInstr *)fileName)->super_BranchInstr).super_Instr.m_opcode = BrUnLe_A;
            return;
          case BrUnLt_A:
            (((MultiBranchInstr *)fileName)->super_BranchInstr).super_Instr.m_opcode = BrUnGe_A;
            return;
          case BrUnLe_A:
            (((MultiBranchInstr *)fileName)->super_BranchInstr).super_Instr.m_opcode = BrUnGt_A;
            return;
          case BrOnNoLocalProperty:
            (((MultiBranchInstr *)fileName)->super_BranchInstr).super_Instr.m_opcode =
                 BrOnHasLocalProperty;
            return;
          case BrNotEq_A:
            (((MultiBranchInstr *)fileName)->super_BranchInstr).super_Instr.m_opcode = BrEq_A;
            return;
          case BrNotNeq_A:
            (((MultiBranchInstr *)fileName)->super_BranchInstr).super_Instr.m_opcode = BrNeq_A;
            return;
          case BrSrNotEq_A:
            (((MultiBranchInstr *)fileName)->super_BranchInstr).super_Instr.m_opcode = BrSrEq_A;
            return;
          case BrSrNotNeq_A:
            (((MultiBranchInstr *)fileName)->super_BranchInstr).super_Instr.m_opcode = BrSrNeq_A;
            return;
          case BrNotGe_A:
            (((MultiBranchInstr *)fileName)->super_BranchInstr).super_Instr.m_opcode = BrGe_A;
            return;
          case BrNotGt_A:
            (((MultiBranchInstr *)fileName)->super_BranchInstr).super_Instr.m_opcode = BrGt_A;
            return;
          case BrNotLt_A:
            (((MultiBranchInstr *)fileName)->super_BranchInstr).super_Instr.m_opcode = BrLt_A;
            return;
          case BrNotLe_A:
            (((MultiBranchInstr *)fileName)->super_BranchInstr).super_Instr.m_opcode = BrLe_A;
            return;
          case BrNotAddr_A:
            (((MultiBranchInstr *)fileName)->super_BranchInstr).super_Instr.m_opcode = BrAddr_A;
            return;
          case BrAddr_A:
            (((MultiBranchInstr *)fileName)->super_BranchInstr).super_Instr.m_opcode = BrNotAddr_A;
            return;
          case BrOnException:
            (((MultiBranchInstr *)fileName)->super_BranchInstr).super_Instr.m_opcode =
                 BrOnNoException;
            return;
          case BrEq_I4:
            (((MultiBranchInstr *)fileName)->super_BranchInstr).super_Instr.m_opcode = BrNeq_I4;
            return;
          case BrTrue_I4:
            (((MultiBranchInstr *)fileName)->super_BranchInstr).super_Instr.m_opcode = BrFalse_I4;
            return;
          case BrFalse_I4:
            (((MultiBranchInstr *)fileName)->super_BranchInstr).super_Instr.m_opcode = BrTrue_I4;
            return;
          case BrGe_I4:
            (((MultiBranchInstr *)fileName)->super_BranchInstr).super_Instr.m_opcode = BrLt_I4;
            return;
          case BrUnGe_I4:
            (((MultiBranchInstr *)fileName)->super_BranchInstr).super_Instr.m_opcode = BrUnLt_I4;
            return;
          case BrGt_I4:
            (((MultiBranchInstr *)fileName)->super_BranchInstr).super_Instr.m_opcode = BrLe_I4;
            return;
          case BrUnGt_I4:
            (((MultiBranchInstr *)fileName)->super_BranchInstr).super_Instr.m_opcode = BrUnLe_I4;
            return;
          case BrLt_I4:
            (((MultiBranchInstr *)fileName)->super_BranchInstr).super_Instr.m_opcode = BrGe_I4;
            return;
          case BrUnLt_I4:
            (((MultiBranchInstr *)fileName)->super_BranchInstr).super_Instr.m_opcode = BrUnGe_I4;
            return;
          case BrLe_I4:
            (((MultiBranchInstr *)fileName)->super_BranchInstr).super_Instr.m_opcode = BrGt_I4;
            return;
          case BrUnLe_I4:
            (((MultiBranchInstr *)fileName)->super_BranchInstr).super_Instr.m_opcode = BrUnGt_I4;
            return;
          case BrNeq_I4:
            (((MultiBranchInstr *)fileName)->super_BranchInstr).super_Instr.m_opcode = BrEq_I4;
            return;
          }
        }
        else {
          if (OVar1 == BrOnNotEmpty) {
            (((MultiBranchInstr *)fileName)->super_BranchInstr).super_Instr.m_opcode = BrOnEmpty;
            return;
          }
          if (OVar1 == BrFncCachedScopeEq) {
            (((MultiBranchInstr *)fileName)->super_BranchInstr).super_Instr.m_opcode =
                 BrFncCachedScopeNeq;
            return;
          }
          if (OVar1 == BrFncCachedScopeNeq) {
            (((MultiBranchInstr *)fileName)->super_BranchInstr).super_Instr.m_opcode =
                 BrFncCachedScopeEq;
            return;
          }
        }
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar9 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                           ,0x7e2,"((0))","Unhandled branch");
        if (bVar7) {
          *puVar9 = 0;
          return;
        }
        pcVar6 = (code *)invalidInstructionException();
        (*pcVar6)();
      }
      plVar14 = plVar3 + 7;
      uVar8 = *(uint *)((long)plVar3 + 0x1c);
      if (uVar8 != 0) {
        uVar12 = 0;
        do {
          iVar13 = *(int *)(*plVar3 + uVar12 * 4);
          if (iVar13 != -1) {
            do {
              lVar11 = (long)iVar13;
              iVar13 = *(int *)(plVar3[1] + 8 + lVar11 * 0x18);
              pLVar4 = *(LabelInstr **)(plVar3[1] + lVar11 * 0x18);
              if (pLVar4 != (LabelInstr *)0x0) {
                LabelInstr::RemoveLabelRef(pLVar4,&this->super_BranchInstr);
              }
            } while (iVar13 != -1);
            uVar8 = *(uint *)((long)plVar3 + 0x1c);
          }
          uVar12 = uVar12 + 1;
        } while (uVar12 < uVar8);
      }
    }
    if ((LabelInstr *)*plVar14 != (LabelInstr *)0x0) {
      LabelInstr::RemoveLabelRef((LabelInstr *)*plVar14,&this->super_BranchInstr);
    }
  }
  this->m_branchTargets = (void *)0x0;
  return;
}

Assistant:

void
MultiBranchInstr::ClearTarget()
{
    Assert(IsMultiBranch());

    MapMultiBrLabels([&](LabelInstr *const targetLabel)
    {
        ChangeLabelRef(targetLabel, nullptr);
    });
    m_branchTargets = nullptr;
}